

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O0

void __thiscall llvm::Triple::setObjectFormat(Triple *this,ObjectFormatType Kind)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  StringRef local_100;
  Twine local_f0;
  Twine local_d8;
  StringRef local_c0;
  Twine local_b0;
  Twine local_98;
  Twine local_80;
  undefined1 local_68 [48];
  StringRef local_38;
  ObjectFormatType local_24;
  Triple *pTStack_20;
  ObjectFormatType Kind_local;
  Triple *this_local;
  undefined1 *local_10;
  
  local_24 = Kind;
  pTStack_20 = this;
  if (this->Environment == UnknownEnvironment) {
    local_38 = getObjectFormatTypeName(Kind);
    setEnvironmentName(this,local_38);
  }
  else {
    local_c0 = getEnvironmentTypeName(this->Environment);
    Twine::Twine(&local_b0,&local_c0);
    Twine::Twine(&local_d8,"-");
    llvm::operator+(&local_98,&local_b0,&local_d8);
    local_100 = getObjectFormatTypeName(local_24);
    Twine::Twine(&local_f0,&local_100);
    llvm::operator+(&local_80,&local_98,&local_f0);
    Twine::str_abi_cxx11_((string *)local_68,&local_80);
    local_10 = local_68 + 0x20;
    this_local = (Triple *)local_68;
    uVar2 = std::__cxx11::string::data();
    auVar1 = local_68._32_16_;
    local_68._32_4_ = (ArchType)uVar2;
    local_68._36_4_ = SUB84(uVar2,4);
    local_68._32_16_ = auVar1;
    uVar2 = std::__cxx11::string::length();
    auVar1 = local_68._32_16_;
    local_68._40_4_ = (VendorType)uVar2;
    local_68._44_4_ = SUB84(uVar2,4);
    local_68._32_16_ = auVar1;
    setEnvironmentName(this,(StringRef)local_68._32_16_);
    std::__cxx11::string::~string((string *)local_68);
  }
  return;
}

Assistant:

void Triple::setObjectFormat(ObjectFormatType Kind) {
  if (Environment == UnknownEnvironment)
    return setEnvironmentName(getObjectFormatTypeName(Kind));

  setEnvironmentName((getEnvironmentTypeName(Environment) + Twine("-") +
                      getObjectFormatTypeName(Kind)).str());
}